

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_btGetAllMatches_extDict_3
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  uint uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  U32 UVar10;
  uint uVar11;
  uint uVar12;
  U32 UVar13;
  int iVar14;
  BYTE *mEnd;
  BYTE *iStart;
  ulong uVar15;
  BYTE *pBVar16;
  size_t sVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong *puVar21;
  ulong *puVar22;
  U32 *pUVar23;
  uint uVar24;
  ulong *puVar25;
  ulong uVar26;
  uint uVar27;
  ulong *puVar28;
  BYTE *pBVar29;
  BYTE *pBVar30;
  U32 UVar31;
  uint uVar32;
  BYTE *__s1;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  bool bVar36;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  BYTE *local_118;
  uint local_fc;
  BYTE *local_e8;
  BYTE *local_d8;
  U32 *local_c8;
  U32 *local_c0;
  U32 local_5c;
  U32 *local_58;
  U32 *local_50;
  ulong local_48;
  ulong *local_40;
  U32 *local_38;
  
  if (3 < (ms->cParams).minMatch) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x33f,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar5 = (ms->window).base;
  uVar26 = (ulong)ms->nextToUpdate;
  UVar10 = 0;
  if (pBVar5 + uVar26 <= ip) {
    while( true ) {
      uVar33 = (uint)uVar26;
      uVar32 = (uint)((long)ip - (long)pBVar5);
      if (uVar32 <= uVar33) break;
      UVar10 = ZSTD_insertBt1(ms,pBVar5 + uVar26,iHighLimit,uVar32,3,1);
      uVar26 = (ulong)(UVar10 + uVar33);
      if (UVar10 + uVar33 <= uVar33) {
        __assert_fail("idx < (U32)(idx + forward)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x236,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
    }
    if ((ulong)((long)ip - (long)pBVar5) >> 0x20 != 0) {
      __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x239,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if ((ulong)((long)iHighLimit - (long)pBVar5) >> 0x20 != 0) {
      __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x23a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    ms->nextToUpdate = uVar32;
    uVar32 = (ms->cParams).targetLength;
    uVar33 = 0xfff;
    if (uVar32 < 0xfff) {
      uVar33 = uVar32;
    }
    uVar32 = (ms->cParams).hashLog;
    local_58 = nextToUpdate3;
    if (0x20 < uVar32) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    local_48 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar32 & 0x1fU));
    pBVar5 = (ms->window).base;
    uVar35 = (int)ip - (int)pBVar5;
    uVar34 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar32 = 0;
    uVar11 = uVar35 - uVar34;
    if (uVar35 < uVar34) {
      uVar11 = 0;
    }
    uVar12 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar10 = (ms->window).lowLimit;
    UVar13 = uVar35 - uVar12;
    if (uVar35 - UVar10 <= uVar12) {
      UVar13 = UVar10;
    }
    if (ms->loadedDictEnd != 0) {
      UVar13 = UVar10;
    }
    uVar19 = UVar13 + (UVar13 == 0);
    uVar12 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    if (1 < ll0) {
      __assert_fail("ll0 <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x27a,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_50 = ms->hashTable;
    uVar27 = local_50[local_48];
    local_38 = ms->chainTable;
    pBVar6 = (ms->window).dictBase;
    uVar4 = (ms->window).dictLimit;
    pBVar29 = (BYTE *)(ulong)uVar4;
    mEnd = pBVar6 + (long)pBVar29;
    iStart = pBVar5 + (long)pBVar29;
    uVar26 = (ulong)((uVar34 & uVar35) * 2);
    local_c8 = local_38 + uVar26;
    local_c0 = local_38 + uVar26 + 1;
    local_fc = uVar35 + 9;
    local_118 = (BYTE *)(ulong)(lengthToBeat - 1);
    puVar22 = (ulong *)(ip + 3);
    bVar36 = true;
    puVar1 = (ulong *)(iHighLimit + -7);
    local_40 = (ulong *)(ip + 0xb);
    puVar2 = (ulong *)(iHighLimit + -3);
    puVar3 = (ulong *)(iHighLimit + -1);
    uVar26 = (ulong)ll0;
    UVar10 = ll0;
    do {
      if (uVar26 == 3) {
        uVar20 = *rep - 1;
      }
      else {
        uVar20 = rep[uVar26];
      }
      if (uVar35 < uVar4) {
        __assert_fail("curr >= dictLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x281,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      uVar24 = uVar35 - uVar20;
      if (uVar20 - 1 < uVar35 - uVar4) {
        pBVar16 = (BYTE *)0x0;
        if ((UVar13 <= uVar24) && (((*(uint *)(ip + -(ulong)uVar20) ^ *(uint *)ip) & 0xffffff) == 0)
           ) {
          puVar21 = (ulong *)((long)puVar22 - (ulong)uVar20);
          puVar25 = puVar22;
          if (puVar22 < puVar1) {
            uVar15 = *puVar22 ^ *puVar21;
            uVar18 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = uVar18 >> 3 & 0x1fffffff;
            iVar14 = (int)uVar18;
            puVar25 = local_40;
            if (*puVar21 == *puVar22) {
              do {
                puVar21 = puVar21 + 1;
                if (puVar1 <= puVar25) goto LAB_006ee96c;
                uVar15 = *puVar21;
                uVar7 = *puVar25;
                uVar8 = 0;
                if ((uVar7 ^ uVar15) != 0) {
                  for (; ((uVar7 ^ uVar15) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                  }
                }
                puVar28 = (ulong *)((uVar8 >> 3 & 0x1fffffff) + (long)puVar25);
                puVar25 = puVar25 + 1;
                if (uVar15 != uVar7) {
                  uVar18 = (long)puVar28 - (long)puVar22;
                  puVar25 = puVar28;
                }
                iVar14 = (int)uVar18;
              } while (uVar15 == uVar7);
            }
          }
          else {
LAB_006ee96c:
            if ((puVar25 < puVar2) && ((int)*puVar21 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar25 < puVar3) && ((short)*puVar21 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar25 < iHighLimit) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar21 == (BYTE)*puVar25));
            }
            iVar14 = (int)puVar25 - (int)puVar22;
          }
          pBVar16 = (BYTE *)(ulong)(iVar14 + 3);
        }
      }
      else {
        if (uVar35 < UVar13) {
          __assert_fail("curr >= windowLow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x28d,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        pBVar16 = (BYTE *)0x0;
        if (((uVar20 - 1 < uVar35 - UVar13) && (uVar24 - uVar4 < 0xfffffffd)) &&
           (((*(uint *)(pBVar6 + uVar24) ^ *(uint *)ip) & 0xffffff) == 0)) {
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)puVar22,(BYTE *)((long)(pBVar6 + uVar24) + 3),iHighLimit,mEnd,
                              iStart);
          pBVar16 = (BYTE *)(ulong)((int)sVar17 + 3);
        }
      }
      uVar20 = (uint)pBVar16;
      bVar9 = true;
      if (local_118 < pBVar16) {
        matches[uVar32].off = ((int)uVar26 - ll0) + 1;
        UVar31 = uVar32 + 1;
        matches[uVar32].len = uVar20;
        bVar9 = ip + (long)pBVar16 != iHighLimit && uVar20 <= uVar33;
        uVar32 = UVar31;
        local_118 = pBVar16;
        if (ip + (long)pBVar16 == iHighLimit || uVar20 > uVar33) {
          UVar10 = UVar31;
        }
      }
      if (!bVar9) break;
      uVar26 = uVar26 + 1;
      bVar36 = uVar26 < ll0 + 3;
    } while (uVar26 != ll0 + 3);
    if (!bVar36) {
      if (local_118 < (BYTE *)0x3) {
        UVar13 = ZSTD_insertAndFindFirstIndexHash3(ms,local_58,ip);
        bVar36 = true;
        if ((uVar19 <= UVar13) && (uVar35 - UVar13 < 0x40000)) {
          if (UVar13 < uVar4) {
            pBVar16 = (BYTE *)ZSTD_count_2segments(ip,pBVar6 + UVar13,iHighLimit,mEnd,iStart);
          }
          else {
            puVar25 = (ulong *)(pBVar5 + UVar13);
            puVar22 = (ulong *)ip;
            if (ip < puVar1) {
              uVar18 = *(ulong *)ip ^ *puVar25;
              uVar26 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              pBVar16 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
              if (*puVar25 == *(ulong *)ip) {
                do {
                  puVar22 = puVar22 + 1;
                  puVar25 = puVar25 + 1;
                  if (puVar1 <= puVar22) goto LAB_006eeb99;
                  uVar18 = *puVar22 ^ *puVar25;
                  uVar26 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  pBVar16 = (BYTE *)((long)puVar22 + ((uVar26 >> 3 & 0x1fffffff) - (long)ip));
                } while (*puVar25 == *puVar22);
              }
            }
            else {
LAB_006eeb99:
              if ((puVar22 < puVar2) && ((int)*puVar25 == (int)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 4);
                puVar25 = (ulong *)((long)puVar25 + 4);
              }
              if ((puVar22 < puVar3) && ((short)*puVar25 == (short)*puVar22)) {
                puVar22 = (ulong *)((long)puVar22 + 2);
                puVar25 = (ulong *)((long)puVar25 + 2);
              }
              if (puVar22 < iHighLimit) {
                puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar22));
              }
              pBVar16 = (BYTE *)((long)puVar22 - (long)ip);
            }
          }
          if ((BYTE *)0x2 < pBVar16) {
            if (uVar35 <= UVar13) {
              __assert_fail("curr > matchIndex3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,0x2ba,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (uVar32 != 0) {
              __assert_fail("mnum==0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,699,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (uVar35 == UVar13) {
              __assert_fail("(curr - matchIndex3)>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,700,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            matches->off = (uVar35 - UVar13) + 3;
            matches->len = (U32)pBVar16;
            uVar32 = 1;
            local_118 = pBVar16;
            if ((BYTE *)(ulong)uVar33 < pBVar16 || ip + (long)pBVar16 == iHighLimit) {
              ms->nextToUpdate = uVar35 + 1;
              bVar36 = false;
              UVar10 = 1;
            }
          }
        }
        if (!bVar36) {
          return UVar10;
        }
      }
      local_50[local_48] = uVar35;
      if (uVar19 <= uVar27) {
        local_e8 = (BYTE *)0x0;
        local_d8 = (BYTE *)0x0;
        do {
          pBVar16 = local_d8;
          if (local_e8 < local_d8) {
            pBVar16 = local_e8;
          }
          if (uVar35 <= uVar27) {
            __assert_fail("curr > matchIndex",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x2cd,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (pBVar16 + uVar27 < pBVar29) {
            pBVar30 = pBVar6 + uVar27;
            iVar14 = bcmp(pBVar30,ip,(size_t)pBVar16);
            if (iVar14 != 0) {
              __assert_fail("memcmp(match, ip, matchLength) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,0x2d6,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            sVar17 = ZSTD_count_2segments
                               (ip + (long)pBVar16,pBVar30 + (long)pBVar16,iHighLimit,mEnd,iStart);
            pBVar16 = pBVar16 + sVar17;
            __s1 = pBVar5 + uVar27;
            if (pBVar16 + uVar27 < pBVar29) {
              __s1 = pBVar30;
            }
          }
          else {
            __s1 = pBVar5 + uVar27;
            if ((uVar4 <= uVar27) && (iVar14 = bcmp(__s1,ip,(size_t)pBVar16), iVar14 != 0)) {
              __assert_fail("memcmp(match, ip, matchLength) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,0x2d2,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            puVar22 = (ulong *)(ip + (long)pBVar16);
            puVar25 = (ulong *)(__s1 + (long)pBVar16);
            puVar21 = puVar22;
            if (puVar22 < puVar1) {
              uVar18 = *puVar22 ^ *puVar25;
              uVar26 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              pBVar30 = (BYTE *)(uVar26 >> 3 & 0x1fffffff);
              if (*puVar25 == *puVar22) {
                do {
                  puVar21 = puVar21 + 1;
                  puVar25 = puVar25 + 1;
                  if (puVar1 <= puVar21) goto LAB_006eee60;
                  uVar18 = *puVar21 ^ *puVar25;
                  uVar26 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  pBVar30 = (BYTE *)((long)puVar21 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar22));
                } while (*puVar25 == *puVar21);
              }
            }
            else {
LAB_006eee60:
              if ((puVar21 < puVar2) && ((int)*puVar25 == (int)*puVar21)) {
                puVar21 = (ulong *)((long)puVar21 + 4);
                puVar25 = (ulong *)((long)puVar25 + 4);
              }
              if ((puVar21 < puVar3) && ((short)*puVar25 == (short)*puVar21)) {
                puVar21 = (ulong *)((long)puVar21 + 2);
                puVar25 = (ulong *)((long)puVar25 + 2);
              }
              if (puVar21 < iHighLimit) {
                puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar21));
              }
              pBVar30 = (BYTE *)((long)puVar21 - (long)puVar22);
            }
            pBVar16 = pBVar30 + (long)pBVar16;
          }
          if (local_118 < pBVar16) {
            if (local_fc < uVar27 || local_fc - uVar27 == 0) {
              __assert_fail("matchEndIdx > matchIndex",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,0x2df,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (uVar27 == uVar35) {
              __assert_fail("(curr - matchIndex)>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,0x2e3,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if ((BYTE *)(ulong)(local_fc - uVar27) < pBVar16) {
              local_fc = uVar27 + (U32)pBVar16;
            }
            matches[uVar32].off = (uVar35 + 3) - uVar27;
            matches[uVar32].len = (U32)pBVar16;
            uVar32 = uVar32 + 1;
            local_118 = pBVar16;
            if (ip + (long)pBVar16 != iHighLimit && pBVar16 < (BYTE *)0x1001) goto LAB_006eef35;
            bVar36 = false;
          }
          else {
LAB_006eef35:
            pUVar23 = local_38 + (uVar27 & uVar34) * 2;
            if (__s1[(long)pBVar16] < ip[(long)pBVar16]) {
              *local_c8 = uVar27;
              local_e8 = pBVar16;
              if (uVar11 < uVar27) {
                pUVar23 = pUVar23 + 1;
                local_c8 = pUVar23;
LAB_006eef89:
                uVar27 = *pUVar23;
                bVar36 = true;
              }
              else {
                bVar36 = false;
                local_c8 = &local_5c;
              }
            }
            else {
              *local_c0 = uVar27;
              local_d8 = pBVar16;
              local_c0 = pUVar23;
              if (uVar11 < uVar27) goto LAB_006eef89;
              bVar36 = false;
              local_c0 = &local_5c;
            }
          }
        } while (((bVar36) && (uVar12 = uVar12 - 1, uVar12 != 0)) && (uVar19 <= uVar27));
      }
      *local_c0 = 0;
      *local_c8 = 0;
      if (0x40000000 < uVar12) {
        __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2fd,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_fc <= uVar35 + 8) {
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x324,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      ms->nextToUpdate = local_fc - 8;
      UVar10 = uVar32;
    }
  }
  return UVar10;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}